

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void bernoulli_number2(int n,double *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double tol;
  double term;
  double t;
  double sum2;
  double sgn;
  double r8_pi;
  int local_28;
  int kmax;
  int k;
  int i;
  double altpi;
  double *b_local;
  int n_local;
  
  if (((-1 < n) && (*b = 1.0, 0 < n)) && (b[1] = -0.5, 1 < n)) {
    dVar1 = log(6.283185307179586);
    dVar2 = log(2.0);
    b[2] = dVar2;
    for (kmax = 3; kmax <= n; kmax = kmax + 1) {
      if (kmax % 2 == 1) {
        b[kmax] = 0.0;
      }
      else {
        dVar2 = log((double)(kmax * (kmax + -1)));
        b[kmax] = dVar2 + b[kmax + -2];
      }
    }
    b[2] = 0.16666666666666666;
    if (3 < n) {
      b[4] = -0.03333333333333333;
      sum2 = -1.0;
      for (kmax = 6; kmax <= n; kmax = kmax + 2) {
        sum2 = -sum2;
        dVar2 = exp(-(double)kmax * dVar1 + b[kmax]);
        t = 1.0;
        for (local_28 = 2; local_28 < 0x191; local_28 = local_28 + 1) {
          dVar3 = pow((double)local_28,(double)-kmax);
          t = t + dVar3;
          if (dVar3 <= t * 1e-06) break;
        }
        b[kmax] = sum2 * 2.0 * dVar2 * t;
      }
    }
  }
  return;
}

Assistant:

BURKHARDT_EXPORT
void bernoulli_number2 ( int n, double b[] )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_NUMBER2 evaluates the Bernoulli numbers.
//
//  Discussion:
//
//    The Bernoulli numbers are rational.
//
//    If we define the sum of the M-th powers of the first N integers as:
//
//      SIGMA(M,N) = sum ( 0 <= I <= N ) I**M
//
//    and let C(I,J) be the combinatorial coefficient:
//
//      C(I,J) = I! / ( ( I - J )! * J! )
//
//    then the Bernoulli numbers B(J) satisfy:
//
//      SIGMA(M,N) = 1/(M+1) * sum ( 0 <= J <= M ) C(M+1,J) B(J) * (N+1)^(M+1-J)
//
//    Note that the Bernoulli numbers grow rapidly.  Bernoulli number
//    62 is probably the last that can be computed on the VAX without
//    overflow.
//
//    A different method than that used in BERN is employed.
//
//  First values:
//
//   B0  1                   =         1.00000000000
//   B1 -1/2                 =        -0.50000000000
//   B2  1/6                 =         1.66666666666
//   B3  0                   =         0
//   B4 -1/30                =        -0.03333333333
//   B5  0                   =         0
//   B6  1/42                =         0.02380952380
//   B7  0                   =         0
//   B8 -1/30                =        -0.03333333333
//   B9  0                   =         0
//  B10  5/66                =         0.07575757575
//  B11  0                   =         0
//  B12 -691/2730            =        -0.25311355311
//  B13  0                   =         0
//  B14  7/6                 =         1.16666666666
//  B15  0                   =         0
//  B16 -3617/510            =        -7.09215686274
//  B17  0                   =         0
//  B18  43867/798           =        54.97117794486
//  B19  0                   =         0
//  B20 -174611/330          =      -529.12424242424
//  B21  0                   =         0
//  B22  854,513/138         =      6192.123
//  B23  0                   =         0
//  B24 -236364091/2730      =    -86580.257
//  B25  0                   =         0
//  B26  8553103/6           =   1425517.16666
//  B27  0                   =         0
//  B28 -23749461029/870     = -27298231.0678
//  B29  0                   =         0
//  B30  8615841276005/14322 = 601580873.901
//
//  Recursion:
//
//    With C(N+1,K) denoting the standard binomial coefficient,
//
//    B(0) = 1.0
//    B(N) = - ( sum ( 0 <= K < N ) C(N+1,K) * B(K) ) / C(N+1,N)
//
//  Special Values:
//
//    Except for B(1), all Bernoulli numbers of odd index are 0.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the highest order Bernoulli number to compute.
//
//    Output, double B[N+1], the requested Bernoulli numbers.
//
{
  double altpi;
  int i;
  int k;
  int kmax = 400;
  const double r8_pi = 3.141592653589793;
  double sgn;
  double sum2;
  double t;
  double term;
  double tol = 1.0E-06;

  if ( n < 0 )
  {
    return;
  }

  b[0] = 1.0;

  if ( n < 1 )
  {
    return;
  }

  b[1] = -0.5;

  if ( n < 2 )
  {
    return;
  }

  altpi = log ( 2.0 * r8_pi );
//
//  Initial estimates for B(I), I = 2 to N
//
  b[2] = log ( 2.0 );

  for ( i = 3; i <= n; i++ )
  {
    if ( ( i % 2 ) == 1 )
    {
      b[i] = 0.0;
    }
    else
    {
      b[i] = log ( double( i * ( i - 1 ) ) ) + b[i-2];
    }
  }

  b[2] = 1.0 / 6.0;

  if ( n <= 3 )
  {
    return;
  }

  b[4] = -1.0 / 30.0;

  sgn = -1.0;

  for ( i = 6; i <= n; i = i + 2 )
  {
    sgn = -sgn;
    t = 2.0 * sgn * exp ( b[i] - double( i ) * altpi );

    sum2 = 1.0;

    for ( k = 2; k <= kmax; k++ )
    {
      term = pow ( double(k), double(-i) );

      sum2 = sum2 + term;

      if ( term <= tol * sum2 )
      {
        break;
      }

    }

    b[i] = t * sum2;

  }

  return;
}